

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O2

bool __thiscall QAbstractSocket::waitForConnected(QAbstractSocket *this,int msecs)

{
  bool bVar1;
  QAbstractSocketPrivate *this_00;
  QAbstractSocketEngine *pQVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  nanoseconds nVar6;
  int iVar7;
  QHostAddress *pQVar8;
  QArrayDataPointer<QHostAddress> *this_01;
  Data *pDVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<QHostAddress> local_78;
  QHostInfo info;
  bool timedOut;
  undefined7 uStack_4f;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&this->field_0x8;
  bVar3 = true;
  if (this_00->state == ConnectedState) goto LAB_001b458b;
  bVar1 = this_00->pendingClose;
  this_00->pendingClose = false;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_48,(long)msecs,CoarseTimer);
  if (this_00->state == HostLookupState) {
    QHostInfo::abortHostLookup(this_00->hostLookupId);
    this_00->hostLookupId = -1;
    _timedOut = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QHostAddress::QHostAddress((QHostAddress *)&timedOut);
    bVar3 = QHostAddress::setAddress((QHostAddress *)&timedOut,&this_00->hostName);
    if (bVar3) {
      this_01 = (QArrayDataPointer<QHostAddress> *)&info;
      info.d_ptr = (QHostInfoPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QHostInfo::QHostInfo((QHostInfo *)this_01,-1);
      local_78.d = (Data *)0x0;
      local_78.ptr = (QHostAddress *)0x0;
      local_78.size = 0;
      QList<QHostAddress>::emplaceBack<QHostAddress_const&>
                ((QList<QHostAddress> *)&local_78,(QHostAddress *)&timedOut);
      QHostInfo::setAddresses((QHostInfo *)this_01,(QList<QHostAddress> *)&local_78);
      QArrayDataPointer<QHostAddress>::~QArrayDataPointer(&local_78);
      QAbstractSocketPrivate::_q_startConnecting(this_00,(QHostInfo *)this_01);
    }
    else {
      this_01 = &local_78;
      QHostInfo::fromName((QHostInfo *)this_01,&this_00->hostName);
      QAbstractSocketPrivate::_q_startConnecting(this_00,(QHostInfo *)this_01);
    }
    QHostInfo::~QHostInfo((QHostInfo *)this_01);
    QHostAddress::~QHostAddress((QHostAddress *)&timedOut);
  }
  lVar5 = *(long *)&this->field_0x8;
  iVar7 = *(int *)(lVar5 + 0x260);
  if (iVar7 == 0) {
    bVar3 = false;
    goto LAB_001b458b;
  }
  timedOut = true;
  while (iVar7 == 2) {
    cVar4 = QDeadlineTimer::hasExpired();
    pQVar8 = (QHostAddress *)local_48._8_8_;
    pDVar9 = (Data *)local_48._0_8_;
    if (cVar4 != '\0') {
      lVar5 = *(long *)&this->field_0x8;
      break;
    }
    if ((Data *)local_48._0_8_ == (Data *)0x7fffffffffffffff) {
      pDVar9 = (Data *)0x7fffffffffffffff;
    }
    else {
      nVar6 = QDeadlineTimer::remainingTimeAsDuration((QDeadlineTimer *)local_48);
      if (30000000000 < nVar6.__r) {
        QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1l>>
                  ((QDeadlineTimer *)&local_78,(duration<long,_std::ratio<1L,_1L>_>)0x1e,CoarseTimer
                  );
        pQVar8 = local_78.ptr;
        pDVar9 = local_78.d;
      }
    }
    _timedOut = (QExplicitlySharedDataPointer<QHostAddressPrivate>)
                ((ulong)_timedOut & 0xffffffffffffff00);
    pQVar2 = this_00->socketEngine;
    if (pQVar2 == (QAbstractSocketEngine *)0x0) {
LAB_001b44c8:
      QAbstractSocketPrivate::_q_connectToNextAddress(this_00);
    }
    else {
      cVar4 = (**(code **)(*(long *)pQVar2 + 0x128))(pQVar2,pDVar9,pQVar8,&timedOut);
      if ((cVar4 == '\0') || (timedOut != false)) goto LAB_001b44c8;
      QAbstractSocketPrivate::_q_testConnection(this_00);
    }
    lVar5 = *(long *)&this->field_0x8;
    iVar7 = *(int *)(lVar5 + 0x260);
  }
  iVar7 = *(int *)(lVar5 + 0x260);
  if (timedOut == true) {
    if (iVar7 == 3) {
      iVar7 = 3;
    }
    else {
LAB_001b4510:
      tr((QString *)&local_78,"Socket operation timed out",(char *)0x0,-1);
      this_00->socketError = SocketTimeoutError;
      QString::operator=((QString *)&this_00->field_0x168,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      this_00->state = UnconnectedState;
      stateChanged(this,UnconnectedState);
      QAbstractSocketPrivate::resetSocketLayer(this_00);
      iVar7 = *(int *)(*(long *)&this->field_0x8 + 0x260);
    }
  }
  else if (iVar7 == 2) goto LAB_001b4510;
  bVar3 = iVar7 == 3;
  if ((bVar3) && (bVar1 != false)) {
    (**(code **)(*(long *)this + 0x100))(this);
  }
LAB_001b458b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractSocket::waitForConnected(int msecs)
{
    Q_D(QAbstractSocket);
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::waitForConnected(%i)", msecs);
#endif

    if (state() == ConnectedState) {
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) already connected", msecs);
#endif
        return true;
    }

    bool wasPendingClose = d->pendingClose;
    d->pendingClose = false;
    QDeadlineTimer deadline{msecs};

    if (d->state == HostLookupState) {
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) doing host name lookup", msecs);
#endif
        QHostInfo::abortHostLookup(d->hostLookupId);
        d->hostLookupId = -1;
        QHostAddress temp;
        if (temp.setAddress(d->hostName)) {
            QHostInfo info;
            info.setAddresses(QList<QHostAddress>() << temp);
            d->_q_startConnecting(info);
        } else {
            d->_q_startConnecting(QHostInfo::fromName(d->hostName));
        }
    }
    if (state() == UnconnectedState)
        return false; // connect not im progress anymore!

    bool timedOut = true;
#if defined (QABSTRACTSOCKET_DEBUG)
    int attempt = 1;
#endif
    while (state() == ConnectingState && !deadline.hasExpired()) {
        QDeadlineTimer timer = deadline;
        if (!deadline.isForever() && deadline.remainingTimeAsDuration() > DefaultConnectTimeout)
            timer = QDeadlineTimer(DefaultConnectTimeout);
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) waiting %.2f secs for connection attempt #%i",
               msecs, timer.remainingTime() / 1000.0, attempt++);
#endif
        timedOut = false;

        if (d->socketEngine && d->socketEngine->waitForWrite(timer, &timedOut) && !timedOut) {
            d->_q_testConnection();
        } else {
            d->_q_connectToNextAddress();
        }
    }

    if ((timedOut && state() != ConnectedState) || state() == ConnectingState) {
        d->setError(SocketTimeoutError, tr("Socket operation timed out"));
        d->state = UnconnectedState;
        emit stateChanged(d->state);
        d->resetSocketLayer();
    }

#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::waitForConnected(%i) == %s", msecs,
           state() == ConnectedState ? "true" : "false");
#endif
    if (state() != ConnectedState)
        return false;
    if (wasPendingClose)
        disconnectFromHost();
    return true;
}